

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplatformfontdatabase.cpp
# Opt level: O0

QSupportedWritingSystems
QPlatformFontDatabase::writingSystemsFromOS2Table(char *os2Table,size_t length)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  ulong in_RDX;
  QWritingSystemsPrivate *in_RDI;
  long in_FS_OFFSET;
  quint32 codePageRange [2];
  quint32 unicodeRange [4];
  quint32 *unicodeRange_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RDX < 0x56) {
    QSupportedWritingSystems::QSupportedWritingSystems((QSupportedWritingSystems *)in_RDI);
  }
  else {
    uVar2 = qFromBigEndian<unsigned_int>(in_RDI);
    uVar3 = qFromBigEndian<unsigned_int>(in_RDI);
    unicodeRange_00 = (quint32 *)CONCAT44(uVar3,uVar2);
    qFromBigEndian<unsigned_int>(in_RDI);
    qFromBigEndian<unsigned_int>(in_RDI);
    uVar2 = qFromBigEndian<unsigned_int>(in_RDI);
    uVar3 = qFromBigEndian<unsigned_int>(in_RDI);
    writingSystemsFromTrueTypeBits(unicodeRange_00,(quint32 *)CONCAT44(uVar3,uVar2));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QSupportedWritingSystems)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QSupportedWritingSystems QPlatformFontDatabase::writingSystemsFromOS2Table(const char *os2Table, size_t length)
{
    if (length >= 86)  {
        quint32 unicodeRange[4] = {
            qFromBigEndian<quint32>(os2Table + 42),
            qFromBigEndian<quint32>(os2Table + 46),
            qFromBigEndian<quint32>(os2Table + 50),
            qFromBigEndian<quint32>(os2Table + 54)
        };
        quint32 codePageRange[2] = {
            qFromBigEndian<quint32>(os2Table + 78),
            qFromBigEndian<quint32>(os2Table + 82)
        };

        return writingSystemsFromTrueTypeBits(unicodeRange, codePageRange);
    }

    return QSupportedWritingSystems();
}